

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::setExpiryTimeout(QThreadPool *this,int expiryTimeout)

{
  long lVar1;
  duration<int,_std::ratio<1L,_1000L>_> dVar2;
  QThreadPoolPrivate *pQVar3;
  int in_ESI;
  long in_FS_OFFSET;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff88;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff90;
  rep_conflict local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QThreadPool *)0x6cc249);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffff90,(QMutex *)in_stack_ffffffffffffff88);
  if (in_ESI < 0) {
    dVar2 = std::chrono::duration<int,_std::ratio<1L,_1000L>_>::max();
    (pQVar3->expiryTimeout).__r = dVar2.__r;
  }
  else {
    ms<(char)49>();
    std::chrono::operator*
              ((int *)in_stack_ffffffffffffff88,(duration<long,_std::ratio<1L,_1000L>_> *)0x6cc2bf);
    std::chrono::duration<int,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<int,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    (pQVar3->expiryTimeout).__r = local_24;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::setExpiryTimeout(int expiryTimeout)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (expiryTimeout < 0)
        d->expiryTimeout = decltype(d->expiryTimeout)::max();
    else
        d->expiryTimeout = expiryTimeout * 1ms;
}